

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall Array::add(Array *this,int item)

{
  element_type *peVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = this->theSize;
  if (this->totSize <= iVar3) {
    iVar3 = (int)((double)this->totSize * 1.5);
    this->totSize = iVar3;
    std::vector<int,_std::allocator<int>_>::resize
              ((this->theArray).
               super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,(long)iVar3);
    iVar3 = this->theSize;
  }
  peVar1 = (this->theArray).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  lVar2 = (long)(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if ((ulong)(long)iVar3 <
      (ulong)((long)(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - lVar2 >> 2)) {
    *(int *)(lVar2 + (long)iVar3 * 4) = item;
    this->theSize = this->theSize + 1;
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void add(int item) {
        if (theSize + 1 > totSize) {
            resize((int) (totSize * 1.5));
        }
        theArray->at(theSize) = (item);
        theSize++;
    }